

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

char * luaO_pushvfstring(lua_State *L,char *fmt,__va_list_tag *argp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  GCObject *pGVar5;
  long *plVar6;
  char *pcVar7;
  undefined8 *puVar8;
  StkId pTVar9;
  int *piVar10;
  lua_Number *plVar11;
  uint uVar12;
  int iVar13;
  lua_Number lVar14;
  char buff [3];
  char local_58;
  byte local_57;
  undefined1 local_56;
  
  pushstr(L,"");
  pcVar4 = strchr(fmt,0x25);
  if (pcVar4 == (char *)0x0) {
    uVar12 = 1;
  }
  else {
    uVar12 = 1;
    do {
      pTVar9 = L->top;
      pGVar5 = (GCObject *)luaS_newlstr(L,fmt,(long)pcVar4 - (long)fmt);
      (pTVar9->value).gc = pGVar5;
      pTVar9->tt = 4;
      pTVar9 = L->top;
      if ((long)L->stack_last - (long)pTVar9 < 0x11) {
        iVar2 = L->stacksize;
        iVar13 = iVar2 * 2;
        if (iVar2 < 1) {
          iVar13 = iVar2 + 1;
        }
        luaD_reallocstack(L,iVar13);
        pTVar9 = L->top;
      }
      L->top = pTVar9 + 1;
      bVar1 = pcVar4[1];
      if (bVar1 < 0x66) {
        if (bVar1 == 0x25) {
          pcVar7 = "%";
        }
        else if (bVar1 == 99) {
          uVar3 = argp->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            pcVar7 = (char *)((ulong)uVar3 + (long)argp->reg_save_area);
            argp->gp_offset = uVar3 + 8;
          }
          else {
            pcVar7 = (char *)argp->overflow_arg_area;
            argp->overflow_arg_area = pcVar7 + 8;
          }
          local_58 = *pcVar7;
          local_57 = 0;
          pcVar7 = &local_58;
        }
        else {
          if (bVar1 == 100) {
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              piVar10 = (int *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              piVar10 = (int *)argp->overflow_arg_area;
              argp->overflow_arg_area = piVar10 + 2;
            }
            lVar14 = (lua_Number)*piVar10;
            goto LAB_00104a85;
          }
LAB_00104a10:
          local_58 = '%';
          local_56 = 0;
          pcVar7 = &local_58;
          local_57 = bVar1;
        }
LAB_00104b2f:
        pushstr(L,pcVar7);
      }
      else {
        if (bVar1 != 0x66) {
          if (bVar1 == 0x70) {
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              puVar8 = (undefined8 *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              puVar8 = (undefined8 *)argp->overflow_arg_area;
              argp->overflow_arg_area = puVar8 + 1;
            }
            sprintf(&local_58,"%p",*puVar8);
            pcVar7 = &local_58;
          }
          else {
            if (bVar1 != 0x73) goto LAB_00104a10;
            uVar3 = argp->gp_offset;
            if ((ulong)uVar3 < 0x29) {
              plVar6 = (long *)((ulong)uVar3 + (long)argp->reg_save_area);
              argp->gp_offset = uVar3 + 8;
            }
            else {
              plVar6 = (long *)argp->overflow_arg_area;
              argp->overflow_arg_area = plVar6 + 1;
            }
            pcVar7 = (char *)*plVar6;
            if ((char *)*plVar6 == (char *)0x0) {
              pcVar7 = "(null)";
            }
          }
          goto LAB_00104b2f;
        }
        uVar3 = argp->fp_offset;
        if ((ulong)uVar3 < 0xa1) {
          plVar11 = (lua_Number *)((ulong)uVar3 + (long)argp->reg_save_area);
          argp->fp_offset = uVar3 + 0x10;
        }
        else {
          plVar11 = (lua_Number *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar11 + 1;
        }
        lVar14 = *plVar11;
LAB_00104a85:
        pTVar9[1].value.n = lVar14;
        pTVar9[1].tt = 3;
        pTVar9 = L->top;
        if ((long)L->stack_last - (long)pTVar9 < 0x11) {
          iVar2 = L->stacksize;
          iVar13 = iVar2 * 2;
          if (iVar2 < 1) {
            iVar13 = iVar2 + 1;
          }
          luaD_reallocstack(L,iVar13);
          pTVar9 = L->top;
        }
        L->top = pTVar9 + 1;
      }
      uVar12 = uVar12 + 2;
      fmt = pcVar4 + 2;
      pcVar4 = strchr(fmt,0x25);
    } while (pcVar4 != (char *)0x0);
  }
  pushstr(L,fmt);
  luaV_concat(L,uVar12 + 1,(int)((ulong)((long)L->top - (long)L->base) >> 4) + -1);
  pTVar9 = L->top;
  L->top = pTVar9 + -(ulong)uVar12;
  return (char *)&((pTVar9[-1 - (ulong)uVar12].value.gc)->h).array;
}

Assistant:

static const char*luaO_pushvfstring(lua_State*L,const char*fmt,va_list argp){
int n=1;
pushstr(L,"");
for(;;){
const char*e=strchr(fmt,'%');
if(e==NULL)break;
setsvalue(L,L->top,luaS_newlstr(L,fmt,e-fmt));
incr_top(L);
switch(*(e+1)){
case's':{
const char*s=va_arg(argp,char*);
if(s==NULL)s="(null)";
pushstr(L,s);
break;
}
case'c':{
char buff[2];
buff[0]=cast(char,va_arg(argp,int));
buff[1]='\0';
pushstr(L,buff);
break;
}
case'd':{
setnvalue(L->top,cast_num(va_arg(argp,int)));
incr_top(L);
break;
}
case'f':{
setnvalue(L->top,cast_num(va_arg(argp,l_uacNumber)));
incr_top(L);
break;
}
case'p':{
char buff[4*sizeof(void*)+8];
sprintf(buff,"%p",va_arg(argp,void*));
pushstr(L,buff);
break;
}
case'%':{
pushstr(L,"%");
break;
}
default:{
char buff[3];
buff[0]='%';
buff[1]=*(e+1);
buff[2]='\0';
pushstr(L,buff);
break;
}
}
n+=2;
fmt=e+2;
}
pushstr(L,fmt);
luaV_concat(L,n+1,cast_int(L->top-L->base)-1);
L->top-=n;
return svalue(L->top-1);
}